

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O0

void u32From(u32 *dest,void *src,size_t count)

{
  void *in_RDX;
  void *in_RSI;
  
  memMove(in_RSI,in_RDX,0x11e455);
  if (((ulong)in_RDX & 3) != 0) {
    memSet(in_RSI,(octet)((ulong)in_RDX >> 0x38),0x11e483);
  }
  return;
}

Assistant:

void u32From(u32 dest[], const void* src, size_t count)
{
	ASSERT(memIsValid(src, count));
	ASSERT(memIsValid(dest, ((count + 3) / 4) * 4));
	memMove(dest, src, count);
	if (count % 4)
		memSetZero((octet*)dest + count, 4 - count % 4);
#if (OCTET_ORDER == BIG_ENDIAN)
	for (count = (count + 3) / 4; count--;)
		dest[count] = u32Rev(dest[count]);
#endif // OCTET_ORDER
}